

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ComputeShaderBuiltinVarTests::init
          (ComputeShaderBuiltinVarTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  ComputeShaderBuiltinVarTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0xf0);
  NumWorkGroupsCase::NumWorkGroupsCase
            ((NumWorkGroupsCase *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xf0);
  WorkGroupSizeCase::WorkGroupSizeCase
            ((WorkGroupSizeCase *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xf0);
  WorkGroupIDCase::WorkGroupIDCase((WorkGroupIDCase *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xf0);
  LocalInvocationIDCase::LocalInvocationIDCase
            ((LocalInvocationIDCase *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xf0);
  GlobalInvocationIDCase::GlobalInvocationIDCase
            ((GlobalInvocationIDCase *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xf0);
  LocalInvocationIndexCase::LocalInvocationIndexCase
            ((LocalInvocationIndexCase *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void ComputeShaderBuiltinVarTests::init (void)
{
	addChild(new NumWorkGroupsCase			(m_context));
	addChild(new WorkGroupSizeCase			(m_context));
	addChild(new WorkGroupIDCase			(m_context));
	addChild(new LocalInvocationIDCase		(m_context));
	addChild(new GlobalInvocationIDCase		(m_context));
	addChild(new LocalInvocationIndexCase	(m_context));
}